

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

QPDFObjGen __thiscall QPDF::nextObjGen(QPDF *this)

{
  size_t i;
  QPDFObjGen QVar1;
  range_error *this_00;
  
  i = getObjectCount(this);
  if ((i & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
  }
  if ((int)i != 0x7fffffff) {
    QVar1.obj = (int)i + 1;
    QVar1.gen = 0;
    return QVar1;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"max object id is too high to create new objects");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

QPDFObjGen
QPDF::nextObjGen()
{
    int max_objid = toI(getObjectCount());
    if (max_objid == std::numeric_limits<int>::max()) {
        throw std::range_error("max object id is too high to create new objects");
    }
    return QPDFObjGen(max_objid + 1, 0);
}